

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall
FNodeBuilder::FindPolyContainers
          (FNodeBuilder *this,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
          TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  FPolyStart *pFVar1;
  uint uVar2;
  int iVar3;
  FPolyStart *pFVar4;
  FPrivVert *pFVar5;
  uint uVar6;
  bool bVar7;
  ulong uVar8;
  FPolyStart *pFVar9;
  FPolyStart *pFVar10;
  long lVar11;
  ulong uVar12;
  DWORD firstseg;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  fixed_t bbox [4];
  int local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  if (spots->Count != 0) {
    local_58 = 1;
    uVar20 = 0;
    do {
      pFVar4 = spots->Array;
      bVar7 = GetPolyExtents(this,pFVar4[uVar20].polynum,&local_48);
      if (bVar7) {
        pFVar4 = pFVar4 + uVar20;
        uVar2 = anchors->Count;
        bVar7 = uVar2 != 0;
        if (uVar2 == 0) {
          pFVar10 = (FPolyStart *)0x0;
        }
        else {
          pFVar10 = anchors->Array;
          if (pFVar10->polynum != pFVar4->polynum) {
            pFVar9 = pFVar10;
            uVar6 = 1;
            do {
              uVar16 = uVar6;
              pFVar10 = pFVar9;
              if (uVar2 == uVar16) break;
              pFVar10 = pFVar9 + 1;
              pFVar1 = pFVar9 + 1;
              pFVar9 = pFVar10;
              uVar6 = uVar16 + 1;
            } while (pFVar1->polynum != pFVar4->polynum);
            bVar7 = uVar16 < uVar2;
          }
        }
        if (bVar7) {
          uVar8 = (ulong)(this->Segs).Count;
          if (uVar8 == 0) {
            firstseg = 0xffffffff;
          }
          else {
            pFVar5 = (this->Vertices).Array;
            iVar17 = SUB84((double)(SUB84((double)((local_48 - local_44) / 2 + local_44) *
                                          1.52587890625e-05 + 103079215104.0,0) +
                                   (pFVar4->y - pFVar10->y)) * 1.52587890625e-05 + 103079215104.0,0)
            ;
            piVar15 = &((this->Segs).Array)->v2;
            uVar13 = 0xffffffff;
            iVar18 = 0x7fffffff;
            uVar12 = 0;
            do {
              iVar19 = pFVar5[*piVar15].super_FSimpleVert.y;
              iVar3 = pFVar5[((FPrivSeg *)(piVar15 + -1))->v1].super_FSimpleVert.y;
              iVar14 = iVar19 - iVar3;
              if (((iVar14 != 0) && ((iVar17 <= iVar19 || (iVar17 <= iVar3)))) &&
                 ((iVar19 <= iVar17 || (iVar3 <= iVar17)))) {
                iVar19 = pFVar5[((FPrivSeg *)(piVar15 + -1))->v1].super_FSimpleVert.x;
                lVar11 = (long)pFVar5[*piVar15].super_FSimpleVert.x - (long)iVar19;
                dVar23 = (double)(int)lVar11;
                dVar22 = (double)iVar14;
                dVar21 = ((double)iVar3 - (double)iVar17) * dVar23 -
                         ((double)iVar19 -
                         (double)SUB84((double)(SUB84((double)((local_3c - local_40) / 2 + local_40)
                                                      * 1.52587890625e-05 + 103079215104.0,0) +
                                               (pFVar4->x - pFVar10->x)) * 1.52587890625e-05 +
                                       103079215104.0,0)) * dVar22;
                if ((((ABS(dVar21) < 17179869184.0) &&
                     ((dVar21 * dVar21) / (dVar22 * dVar22 + dVar23 * dVar23) < 42.94967296)) ||
                    (0.0 < dVar21)) &&
                   (iVar19 = (iVar19 - pFVar4->x) +
                             (int)((ulong)((int)(((long)(iVar17 - iVar3) << 0x1e) / (long)iVar14) *
                                          lVar11) >> 0x1e), iVar19 < iVar18 && -1 < iVar19)) {
                  uVar13 = uVar12 & 0xffffffff;
                  iVar18 = iVar19;
                }
              }
              firstseg = (DWORD)uVar13;
              uVar12 = uVar12 + 1;
              piVar15 = piVar15 + 0x12;
            } while (uVar8 != uVar12);
          }
          if (firstseg != 0xffffffff) {
            local_58 = MarkLoop(this,firstseg,local_58);
          }
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < spots->Count);
  }
  return;
}

Assistant:

void FNodeBuilder::FindPolyContainers (TArray<FPolyStart> &spots, TArray<FPolyStart> &anchors)
{
	int loop = 1;

	for (unsigned int i = 0; i < spots.Size(); ++i)
	{
		FPolyStart *spot = &spots[i];
		fixed_t bbox[4];

		if (GetPolyExtents (spot->polynum, bbox))
		{
			FPolyStart *anchor = NULL;

			unsigned int j;

			for (j = 0; j < anchors.Size(); ++j)
			{
				anchor = &anchors[j];
				if (anchor->polynum == spot->polynum)
				{
					break;
				}
			}

			if (j < anchors.Size())
			{
				vertex_t mid;
				vertex_t center;

				mid.set(bbox[BOXLEFT] + (bbox[BOXRIGHT]-bbox[BOXLEFT])/2,
						bbox[BOXBOTTOM] + (bbox[BOXTOP]-bbox[BOXBOTTOM])/2);

				center.set(mid.fixX() - anchor->x + spot->x,
							mid.fixY() - anchor->y + spot->y);

				// Scan right for the seg closest to the polyobject's center after it
				// gets moved to its start spot.
				fixed_t closestdist = FIXED_MAX;
				unsigned int closestseg = UINT_MAX;

				P(Printf ("start %d,%d -- center %d, %d\n", spot->x>>16, spot->y>>16, center.fixX()>>16, center.fixY()>>16));

				for (unsigned int j = 0; j < Segs.Size(); ++j)
				{
					FPrivSeg *seg = &Segs[j];
					FPrivVert *v1 = &Vertices[seg->v1];
					FPrivVert *v2 = &Vertices[seg->v2];
					fixed_t dy = v2->y - v1->y;

					if (dy == 0)
					{ // Horizontal, so skip it
						continue;
					}
					if ((v1->y < center.fixY() && v2->y < center.fixY()) || (v1->y > center.fixY() && v2->y > center.fixY()))
					{ // Not crossed
						continue;
					}

					fixed_t dx = v2->x - v1->x;

					if (PointOnSide (center.fixX(), center.fixY(), v1->x, v1->y, dx, dy) <= 0)
					{
						fixed_t t = DivScale30 (center.fixY() - v1->y, dy);
						fixed_t sx = v1->x + MulScale30 (dx, t);
						fixed_t dist = sx - spot->x;

						if (dist < closestdist && dist >= 0)
						{
							closestdist = dist;
							closestseg = (long)j;
						}
					}
				}
				if (closestseg != UINT_MAX)
				{
					loop = MarkLoop (closestseg, loop);
					P(Printf ("Found polyobj in sector %d (loop %d)\n", Segs[closestseg].frontsector,
						Segs[closestseg].loopnum));
				}
			}
		}
	}
}